

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::compute_quotient_into(char *new_ext,char *new_rem_ext,char *ext1,char *ext2)

{
  undefined8 uVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  undefined8 *puVar16;
  long *plVar17;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int comp_res;
  int exp_diff;
  char *tmp;
  int dig_approx;
  int dvs_approx;
  int rem_approx;
  err_frame_t err_cur__;
  size_t rem_prec;
  int acc;
  int zero_remainder;
  int lead_dig_set;
  uint dvs_hdl2;
  char *dvs_ext2;
  uint dvs_hdl;
  char *dvs_ext;
  size_t dvs_prec;
  size_t dvd_prec;
  size_t quo_prec;
  size_t quo_idx;
  int quo_exp;
  uint rem_hdl2;
  char *rem_ext2;
  uint rem_hdl;
  char *rem_ext;
  undefined1 *puVar18;
  char *in_stack_fffffffffffffe10;
  uint *ext;
  char *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  char *ext1_00;
  int local_18c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe94;
  void *local_160;
  size_t local_90;
  uint local_88;
  uint local_7c;
  undefined1 local_78 [12];
  uint local_6c;
  char *local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  int local_40;
  uint local_3c;
  char *local_38;
  uint local_2c;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_50 = get_prec((char *)0x2c0cb4);
  local_58 = get_prec((char *)0x2c0cc9);
  local_60 = get_prec((char *)0x2c0cde);
  iVar5 = is_zero(local_20);
  if (iVar5 != 0) {
    err_throw(0);
  }
  iVar5 = is_zero(local_18);
  if (iVar5 != 0) {
    set_zero(in_stack_fffffffffffffe10);
    if (local_10 == (char *)0x0) {
      return;
    }
    set_zero(in_stack_fffffffffffffe10);
    return;
  }
  local_90 = local_58;
  if (local_58 < local_60) {
    local_90 = local_60;
  }
  local_90 = local_90 + 2;
  if (local_90 < 3) {
    local_90 = 3;
  }
  puVar18 = local_78;
  ext = &local_7c;
  alloc_temp_regs(local_90,3,&local_28,&local_2c,&local_38,&local_3c);
  puVar16 = (undefined8 *)_ZTW11G_err_frame();
  uVar1 = *puVar16;
  plVar17 = (long *)_ZTW11G_err_frame();
  *plVar17 = (long)&stack0xfffffffffffffe90;
  uVar6 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffea8);
  if (uVar6 == 0) {
    alloc_temp_regs(local_60,1,&local_68,&local_6c);
  }
  if (uVar6 == 1) {
    uVar6 = 2;
    release_temp_regs(3,(ulong)local_2c,(ulong)local_3c,(ulong)local_7c);
    err_rethrow();
  }
  puVar16 = (undefined8 *)_ZTW11G_err_frame();
  *puVar16 = uVar1;
  if ((uVar6 & 0x4001) != 0) {
    puVar16 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar16 & 2) != 0) {
      plVar17 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar17 + 0x10));
    }
    plVar17 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar17 + 0x10) = local_160;
    err_rethrow();
  }
  if ((uVar6 & 2) != 0) {
    free(local_160);
  }
  copy_val((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
           in_stack_fffffffffffffe18,(int)((ulong)ext >> 0x20));
  copy_val((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
           in_stack_fffffffffffffe18,(int)((ulong)ext >> 0x20));
  bVar3 = false;
  iVar5 = get_exp((char *)0x2c0f5d);
  iVar7 = get_exp((char *)0x2c0f6e);
  local_40 = (iVar5 - iVar7) + 1;
  ext1_00 = local_68;
  get_exp((char *)0x2c0f9a);
  set_exp((char *)ext,(int)((ulong)puVar18 >> 0x20));
  bVar4 = false;
  if ((local_10 == (char *)0x0) || (0 < local_40)) {
    local_48 = 0;
    do {
      local_88 = 0;
      uVar8 = get_dig(local_28,0);
      uVar9 = get_dig(local_28,1);
      uVar10 = get_dig(local_28,2);
      iVar11 = uVar8 * 100 + uVar9 * 10 + uVar10;
      uVar8 = get_dig(local_68,0);
      iVar7 = uVar8 * 100;
      if (local_60 < 2) {
        uVar8 = 0;
      }
      else {
        uVar8 = get_dig(local_68,1);
      }
      iVar12 = iVar7 + uVar8 * 10;
      if (local_60 < 3) {
        uVar9 = 0;
      }
      else {
        uVar9 = get_dig(local_68,2);
      }
      iVar13 = iVar12 + uVar9 + 1;
      iVar14 = get_exp((char *)0x2c1103);
      local_18c = get_exp((char *)0x2c1114);
      local_18c = iVar14 - local_18c;
      if (local_18c < 1) {
        if (local_18c < -2) {
          iVar13 = 1000;
        }
        else if (local_18c < 0) {
          for (; local_18c < 0; local_18c = local_18c + 1) {
            iVar13 = iVar13 * 10;
          }
        }
      }
      else {
        for (; 0 < local_18c; local_18c = local_18c + -1) {
          iVar11 = iVar11 * 10;
        }
      }
      uVar15 = iVar11 / iVar13;
      uVar10 = uVar15;
      if (2 < (int)uVar15) {
        copy_val((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18,(int)((ulong)ext >> 0x20));
        mul_by_long((char *)CONCAT44(uVar8,iVar12),CONCAT44(uVar9,iVar14));
        compute_abs_diff_into
                  ((char *)CONCAT44(in_stack_fffffffffffffe94,uVar6),(char *)CONCAT44(iVar11,iVar13)
                   ,(char *)CONCAT44(uVar10,in_stack_fffffffffffffe80));
        iVar12 = is_zero(local_38);
        pcVar2 = local_28;
        if (iVar12 != 0) {
          bVar4 = true;
          goto LAB_002c1480;
        }
        local_28 = local_38;
        local_38 = pcVar2;
        local_88 = uVar15;
      }
      while (iVar12 = compare_abs(ext1_00,(char *)CONCAT44(iVar5,iVar7)), -1 < iVar12) {
        if (iVar12 == 0) {
          bVar4 = true;
          local_88 = local_88 + 1;
          break;
        }
        compute_abs_diff_into
                  ((char *)CONCAT44(in_stack_fffffffffffffe94,uVar6),(char *)CONCAT44(iVar11,iVar13)
                   ,(char *)CONCAT44(uVar10,in_stack_fffffffffffffe80));
        pcVar2 = local_38;
        local_38 = local_28;
        local_88 = local_88 + 1;
        local_28 = pcVar2;
      }
      if (local_48 < local_50) {
        set_dig(local_8,local_48,local_88);
      }
      else if (local_48 == local_50) {
        set_exp((char *)ext,(int)((ulong)puVar18 >> 0x20));
        round_for_dropped_digits((char *)ext,(int)((ulong)puVar18 >> 0x20),(int)puVar18);
        goto LAB_002c1480;
      }
      if (local_88 != 0) {
        bVar3 = true;
      }
      if (bVar3) {
        local_48 = local_48 + 1;
      }
      else {
        local_40 = local_40 + -1;
      }
      if ((bVar4) ||
         ((local_10 != (char *)0x0 && (((int)local_48 == local_40 || (local_48 == local_50))))))
      goto LAB_002c13fd;
      get_exp((char *)0x2c146c);
      set_exp((char *)ext,(int)((ulong)puVar18 >> 0x20));
    } while( true );
  }
  copy_val((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
           in_stack_fffffffffffffe18,(int)((ulong)ext >> 0x20));
  set_zero((char *)ext);
LAB_002c1545:
  release_temp_regs(4,(ulong)local_2c,(ulong)local_3c,(ulong)local_6c,(ulong)local_7c);
  return;
LAB_002c13fd:
  for (; local_48 < local_50; local_48 = local_48 + 1) {
    set_dig(local_8,local_48,0);
  }
  set_exp((char *)ext,(int)((ulong)puVar18 >> 0x20));
LAB_002c1480:
  if (local_10 != (char *)0x0) {
    if (bVar4) {
      set_zero((char *)ext);
    }
    else {
      copy_val((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,(int)((ulong)ext >> 0x20));
      iVar5 = get_neg(local_18);
      set_neg(local_10,iVar5);
      normalize((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    }
  }
  iVar5 = get_neg(local_18);
  iVar7 = get_neg(local_20);
  set_neg(local_8,(uint)(iVar5 != iVar7));
  normalize((char *)CONCAT44(iVar5,in_stack_fffffffffffffe20));
  goto LAB_002c1545;
}

Assistant:

void CVmObjBigNum::compute_quotient_into(char *new_ext,
                                         char *new_rem_ext,
                                         const char *ext1, const char *ext2)
{
    char *rem_ext;
    uint rem_hdl;
    char *rem_ext2;
    uint rem_hdl2;
    int quo_exp;
    size_t quo_idx;
    size_t quo_prec = get_prec(new_ext);
    size_t dvd_prec = get_prec(ext1);
    size_t dvs_prec = get_prec(ext2);
    char *dvs_ext;
    uint dvs_hdl;
    char *dvs_ext2;
    uint dvs_hdl2;
    int lead_dig_set;
    int zero_remainder;
    int acc;
    size_t rem_prec;

    /* if the divisor is zero, throw an error */
    if (is_zero(ext2))
        err_throw(VMERR_DIVIDE_BY_ZERO);

    /* if the dividend is zero, the result is zero */
    if (is_zero(ext1))
    {
        /* set the result to zero */
        set_zero(new_ext);

        /* if they want the remainder, it's zero also */
        if (new_rem_ext != 0)
            set_zero(new_rem_ext);

        /* we're done */
        return;
    }

    /* 
     *   Calculate the precision we need for the running remainder.  We
     *   must retain enough precision in the remainder to calculate exact
     *   differences, so we need the greater of the precisions of the
     *   dividend and the divisor, plus enough extra digits for the
     *   maximum relative shifting.  We'll have to shift at most one
     *   extra digit, but use two to be extra safe.  
     */
    rem_prec = dvd_prec;
    if (rem_prec < dvs_prec)
        rem_prec = dvs_prec;
    rem_prec += 2;

    /*   
     *   Make sure the precision is at least three, since it simplifies
     *   our digit approximation calculation.  
     */
    if (rem_prec < 3)
        rem_prec = 3;

    /* 
     *   Allocate two temporary registers for the running remainder, and
     *   one more for the multiplied divisor.  Note that we allocate the
     *   multiplied divisor at our higher precision so that we don't lose
     *   digits in our multiplier calculations.  
     */
    alloc_temp_regs(rem_prec, 3,
                    &rem_ext, &rem_hdl, &rem_ext2, &rem_hdl2,
                    &dvs_ext2, &dvs_hdl2);

    /* 
     *   Allocate another temp register for the shifted divisor.  Note
     *   that we need a different precision here, which is why we must
     *   make a separate allocation call 
     */
    err_try
    {
        /* make the additional allocation */
        alloc_temp_regs(dvs_prec, 1, &dvs_ext, &dvs_hdl);
    }